

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::lexUntilQuote(Lexer *this,SyntaxToken *tk,uchar quote,uint accLeng)

{
  char *s;
  CharacterConstant *pCVar1;
  StringLiteral *pSVar2;
  uint size;
  bool bVar3;
  int yyleng;
  char *yytext;
  uint accLeng_local;
  uchar quote_local;
  SyntaxToken *tk_local;
  Lexer *this_local;
  
  s = this->yytext_ + (-1 - (ulong)accLeng);
  while( true ) {
    bVar3 = false;
    if ((this->yychar_ != '\0') && (bVar3 = false, this->yychar_ != quote)) {
      bVar3 = this->yychar_ != '\n';
    }
    if (!bVar3) break;
    if (this->yychar_ == '\\') {
      lexBackslash(this,tk->syntaxK_);
    }
    else {
      yyinput(this);
    }
  }
  size = accLeng + ((int)this->yytext_ - (int)s) + 1;
  if (this->yychar_ == quote) {
    yyinput(this);
  }
  if (quote == '\'') {
    pCVar1 = SyntaxTree::findOrInsertCharacterConstant(this->tree_,s,size);
    (tk->field_10).character_ = pCVar1;
  }
  else {
    pSVar2 = SyntaxTree::findOrInsertStringLiteral(this->tree_,s,size);
    (tk->field_10).string_ = pSVar2;
  }
  return;
}

Assistant:

void Lexer::lexUntilQuote(SyntaxToken* tk, unsigned char quote, unsigned int accLeng)
{
    const char* yytext = yytext_ - 1;
    yytext -= accLeng;

    while (yychar_
               && yychar_ != quote
               && yychar_ != '\n') {
        if (yychar_ == '\\')
            lexBackslash(tk->syntaxK_);
        else
            yyinput();
    }

    int yyleng = yytext_ - yytext + 1;
    yyleng += accLeng;

    if (yychar_ == quote)
        yyinput();

    if (quote == '\'')
        tk->character_ = tree_->findOrInsertCharacterConstant(yytext, yyleng);
    else
        tk->string_ = tree_->findOrInsertStringLiteral(yytext, yyleng);
}